

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_schnorrsig_bip_vectors_check_signing
               (uchar *sk,uchar *pk_serialized,uchar *aux_rand,uchar *msg,size_t msglen,
               uchar *expected_sig)

{
  int iVar1;
  secp256k1_schnorrsig_extraparams *in_RDX;
  long in_R8;
  void *in_R9;
  secp256k1_schnorrsig_extraparams extraparams;
  secp256k1_xonly_pubkey pk_expected;
  secp256k1_xonly_pubkey pk;
  secp256k1_keypair keypair;
  uchar sig [64];
  uchar *aux_rand32;
  secp256k1_keypair *keypair_00;
  secp256k1_keypair *in_stack_fffffffffffffea8;
  secp256k1_context *in_stack_fffffffffffffeb0;
  uchar *in_stack_fffffffffffffeb8;
  uchar *in_stack_fffffffffffffec0;
  secp256k1_context *in_stack_fffffffffffffec8;
  secp256k1_keypair *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffef0;
  secp256k1_context *in_stack_fffffffffffffef8;
  uchar *in_stack_ffffffffffffff08;
  secp256k1_keypair *in_stack_ffffffffffffff10;
  secp256k1_context *in_stack_ffffffffffffff18;
  undefined1 local_78 [72];
  void *local_30;
  long local_28;
  
  aux_rand32 = (uchar *)0x8cb36fda;
  keypair_00 = (secp256k1_keypair *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  iVar1 = secp256k1_keypair_create
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0xd7,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk)");
    abort();
  }
  iVar1 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (size_t)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_RDX);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0xd8,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, msglen, &keypair, &extraparams)"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_78,local_30,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0xd9,"test condition failed: secp256k1_memcmp_var(sig, expected_sig, 64) == 0");
    abort();
  }
  if (local_28 == 0x20) {
    memset(local_78,0,0x40);
    iVar1 = secp256k1_schnorrsig_sign32
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8->data,in_RDX->magic,
                       keypair_00,aux_rand32);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
              ,0xdc,
              "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, aux_rand)"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_78,local_30,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
              ,0xdd,"test condition failed: secp256k1_memcmp_var(sig, expected_sig, 64) == 0");
      abort();
    }
  }
  iVar1 = secp256k1_xonly_pubkey_parse
                    (in_stack_ffffffffffffff18,(secp256k1_xonly_pubkey *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0xe0,
            "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk_expected, pk_serialized)")
    ;
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     in_stack_fffffffffffffee0);
  if (iVar1 != 0) {
    iVar1 = secp256k1_memcmp_var(&stack0xfffffffffffffee8,&stack0xfffffffffffffea8,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
              ,0xe2,
              "test condition failed: secp256k1_memcmp_var(&pk, &pk_expected, sizeof(pk)) == 0");
      abort();
    }
    iVar1 = secp256k1_schnorrsig_verify
                      ((secp256k1_context *)keypair.data._72_8_,(uchar *)keypair.data._64_8_,
                       (uchar *)keypair.data._56_8_,keypair.data._48_8_,
                       (secp256k1_xonly_pubkey *)keypair.data._40_8_);
    if (iVar1 != 0) {
      return;
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0xe3,"test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, msglen, &pk)");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
          ,0xe1,"test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair)");
  abort();
}

Assistant:

static void test_schnorrsig_bip_vectors_check_signing(const unsigned char *sk, const unsigned char *pk_serialized, const unsigned char *aux_rand, const unsigned char *msg, size_t msglen, const unsigned char *expected_sig) {
    unsigned char sig[64];
    secp256k1_keypair keypair;
    secp256k1_xonly_pubkey pk, pk_expected;

    secp256k1_schnorrsig_extraparams extraparams = SECP256K1_SCHNORRSIG_EXTRAPARAMS_INIT;
    extraparams.ndata = (unsigned char*)aux_rand;

    CHECK(secp256k1_keypair_create(CTX, &keypair, sk));
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, msglen, &keypair, &extraparams));
    CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    if (msglen == 32) {
        memset(sig, 0, 64);
        CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, aux_rand));
        CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    }

    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk_expected, pk_serialized));
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair));
    CHECK(secp256k1_memcmp_var(&pk, &pk_expected, sizeof(pk)) == 0);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, msglen, &pk));
}